

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcid.c
# Opt level: O0

FT_Error FT_Get_CID_From_Glyph_Index(FT_Face face,FT_UInt glyph_index,FT_UInt *cid)

{
  FT_Driver pFVar1;
  FT_Module_Interface local_40;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_CID service;
  FT_UInt c;
  FT_Error error;
  FT_UInt *cid_local;
  FT_Face pFStack_10;
  FT_UInt glyph_index_local;
  FT_Face face_local;
  
  service._4_4_ = 6;
  service._0_4_ = 0;
  _c = cid;
  if (face != (FT_Face)0x0) {
    pFVar1 = face->driver;
    local_40 = (FT_Module_Interface)0x0;
    cid_local._4_4_ = glyph_index;
    pFStack_10 = face;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_40 = (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"CID");
    }
    if ((local_40 != (FT_Module_Interface)0x0) && (*(long *)((long)local_40 + 0x10) != 0)) {
      service._4_4_ = (**(code **)((long)local_40 + 0x10))(pFStack_10,cid_local._4_4_,&service);
    }
  }
  if (_c != (FT_UInt *)0x0) {
    *_c = (FT_UInt)service;
  }
  return service._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_CID_From_Glyph_Index( FT_Face   face,
                               FT_UInt   glyph_index,
                               FT_UInt  *cid )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_UInt   c = 0;


    if ( face )
    {
      FT_Service_CID  service;


      FT_FACE_FIND_SERVICE( face, service, CID );

      if ( service && service->get_cid_from_glyph_index )
        error = service->get_cid_from_glyph_index( face, glyph_index, &c);
    }

    if ( cid )
      *cid = c;

    return error;
  }